

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Declarations.cpp
# Opt level: O1

bool __thiscall
psy::C::Parser::parseExtGNU_AttributeSpecifierList_AtFirst
          (Parser *this,SpecifierListSyntax **specList)

{
  bool bVar1;
  SyntaxToken *pSVar2;
  SyntaxNodePlainList<psy::C::SpecifierSyntax_*> *pSVar3;
  ostream *poVar4;
  SpecifierSyntax *spec;
  SpecifierSyntax *local_28;
  
  pSVar2 = peek(this,1);
  if (pSVar2->syntaxK_ == KeywordAlias___attribute) {
    do {
      local_28 = (SpecifierSyntax *)0x0;
      bVar1 = parseExtGNU_AttributeSpecifier_AtFirst(this,&local_28);
      if (!bVar1) {
        return bVar1;
      }
      pSVar3 = makeNode<psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax*>,psy::C::SpecifierSyntax*&>
                         (this,&local_28);
      *specList = pSVar3;
      specList = &(pSVar3->
                  super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                  ).
                  super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                  .next;
      pSVar2 = peek(this,1);
    } while (pSVar2->syntaxK_ == KeywordAlias___attribute);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Declarations.cpp"
               ,100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x653);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"assert failure: `__attribute__\'",0x1f);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Parser::parseExtGNU_AttributeSpecifierList_AtFirst(SpecifierListSyntax*& specList)
{
    DBG_THIS_RULE();
    PSY_ASSERT_3(peek().kind() == SyntaxKind::Keyword_ExtGNU___attribute__,
                  return false,
                  "assert failure: `__attribute__'");

    SpecifierListSyntax** specList_cur = &specList;

    do {
        SpecifierSyntax* spec = nullptr;
        if (!parseExtGNU_AttributeSpecifier_AtFirst(spec))
            return false;

        *specList_cur = makeNode<SpecifierListSyntax>(spec);
        specList_cur = &(*specList_cur)->next;
    }
    while (peek().kind() == SyntaxKind::Keyword_ExtGNU___attribute__);

    return true;
}